

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_Symbol_search(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  BOOL BVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar6;
  JSValueUnion JVar7;
  int64_t iVar8;
  ulong uVar9;
  JSValue JVar11;
  JSValue op1;
  JSValue JVar12;
  JSValue op1_00;
  undefined4 local_38;
  JSValueUnion JVar5;
  int64_t iVar10;
  
  uVar6 = (ulong)(uint)argc;
  if ((int)this_val.tag == -1) {
    JVar11 = JS_ToString(ctx,*argv);
    JVar4 = JVar11.u;
    iVar10 = 3;
    if ((int)JVar11.tag == 6) {
      JVar12 = (JSValue)(ZEXT816(3) << 0x40);
      op1_00 = (JSValue)(ZEXT816(3) << 0x40);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      op1 = (JSValue)(auVar1 << 0x40);
    }
    else {
      op1 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
      iVar10 = op1.tag;
      JVar5 = op1.u;
      if ((int)op1.tag == 6) {
        JVar12 = (JSValue)(ZEXT816(3) << 0x40);
        op1_00 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        BVar2 = js_same_value(ctx,op1,(JSValue)ZEXT816(0));
        if (BVar2 == 0) {
          JVar7.float64 = 4.1995579896506e-322;
          iVar3 = JS_SetProperty(ctx,this_val,0x55,(JSValue)ZEXT816(0));
          if (-1 < iVar3) goto LAB_001374d4;
          JVar12 = (JSValue)(ZEXT816(3) << 0x40);
          JVar4 = JVar7;
        }
        else {
LAB_001374d4:
          JVar12 = JS_RegExpExec(ctx,this_val,JVar11);
          if ((JVar12.tag & 0xffffffffU) != 6) {
            iVar8 = 0x55;
            op1_00 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
            if ((int)op1_00.tag != 6) {
              BVar2 = js_same_value(ctx,op1_00,op1);
              if (BVar2 == 0) {
                iVar8 = 0x55;
                iVar3 = JS_SetProperty(ctx,this_val,0x55,op1);
                if (iVar3 < 0) {
                  op1 = (JSValue)(ZEXT816(3) << 0x40);
                  goto LAB_00137548;
                }
              }
              else {
                JS_FreeValue(ctx,op1);
              }
              JS_FreeValue(ctx,JVar11);
              JS_FreeValue(ctx,op1_00);
              local_38 = (int)JVar12.tag;
              if (local_38 == 2) {
                uVar6 = 0xffffffff;
                uVar9 = 0;
                iVar10 = 0;
              }
              else {
                JVar11 = JS_GetPropertyInternal(ctx,JVar12,0x57,JVar12,0);
                iVar10 = JVar11.tag;
                JS_FreeValue(ctx,JVar12);
                uVar9 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
                uVar6 = (ulong)JVar11.u.ptr & 0xffffffff;
              }
              goto LAB_001375d5;
            }
LAB_00137548:
            iVar10 = op1.tag;
            JVar4 = op1.u;
            op1.tag = iVar8;
            op1.u.float64 = JVar4.float64;
            goto LAB_00137597;
          }
        }
        op1_00 = (JSValue)(ZEXT816(3) << 0x40);
        op1.tag = (int64_t)JVar4.ptr;
        op1.u.float64 = JVar5.float64;
      }
    }
LAB_00137597:
    JS_FreeValue(ctx,JVar12);
    JS_FreeValue(ctx,JVar11);
    JS_FreeValue(ctx,op1_00);
    JVar11.tag = iVar10;
    JVar11.u.float64 = op1.u.float64;
    JS_FreeValue(ctx,JVar11);
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar10 = 6;
  uVar6 = 0;
  uVar9 = 0;
LAB_001375d5:
  JVar12.u.ptr = (void *)(uVar6 | uVar9);
  JVar12.tag = iVar10;
  return JVar12;
}

Assistant:

static JSValue js_regexp_Symbol_search(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst rx = this_val;
    JSValue str, previousLastIndex, currentLastIndex, result, index;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    result = JS_UNDEFINED;
    currentLastIndex = JS_UNDEFINED;
    previousLastIndex = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;

    previousLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(previousLastIndex))
        goto exception;

    if (!js_same_value(ctx, previousLastIndex, JS_NewInt32(ctx, 0))) {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0) {
            goto exception;
        }
    }
    result = JS_RegExpExec(ctx, rx, str);
    if (JS_IsException(result))
        goto exception;
    currentLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(currentLastIndex))
        goto exception;
    if (js_same_value(ctx, currentLastIndex, previousLastIndex)) {
        JS_FreeValue(ctx, previousLastIndex);
    } else {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, previousLastIndex) < 0) {
            previousLastIndex = JS_UNDEFINED;
            goto exception;
        }
    }
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);

    if (JS_IsNull(result)) {
        return JS_NewInt32(ctx, -1);
    } else {
        index = JS_GetProperty(ctx, result, JS_ATOM_index);
        JS_FreeValue(ctx, result);
        return index;
    }

exception:
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);
    JS_FreeValue(ctx, previousLastIndex);
    return JS_EXCEPTION;
}